

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

SamplerType glu::TextureTestUtil::getFetchSamplerType(TextureFormat format)

{
  ulong uVar1;
  
  uVar1 = (ulong)format >> 0x20;
  if (format.type < HALF_FLOAT) {
    if ((0x38000000UL >> (uVar1 & 0x3f) & 1) != 0) {
      return SAMPLERTYPE_FETCH_INT;
    }
    if ((0x240200000U >> (uVar1 & 0x3f) & 1) != 0) {
      return SAMPLERTYPE_FETCH_UINT;
    }
    if ((0x82000000UL >> (uVar1 & 0x3f) & 1) != 0) {
      return (uint)((format.order - D & 0xfffffffd) != 0) * 2 + SAMPLERTYPE_FETCH_FLOAT;
    }
  }
  return SAMPLERTYPE_FETCH_FLOAT;
}

Assistant:

SamplerType getFetchSamplerType (tcu::TextureFormat format)
{
	using tcu::TextureFormat;

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
			return SAMPLERTYPE_FETCH_INT;

		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			return SAMPLERTYPE_FETCH_UINT;

		// Texture formats used in depth/stencil textures.
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT_24_8:
			return (format.order == TextureFormat::D || format.order == TextureFormat::DS) ? SAMPLERTYPE_FETCH_FLOAT : SAMPLERTYPE_FETCH_UINT;

		default:
			return SAMPLERTYPE_FETCH_FLOAT;
	}
}